

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# common.c
# Opt level: O1

int write_dns_answer(char *buffer,char *name,int type,int class,int ttl,void *rdata)

{
  ushort *puVar1;
  undefined8 uVar2;
  int iVar3;
  int iVar4;
  uint uVar5;
  
  iVar3 = str_to_label(buffer,name,0x208);
  iVar4 = -1;
  if (iVar3 != -1) {
    iVar4 = 0;
    if ((uint)type < 0x10000) {
      iVar4 = type;
    }
    puVar1 = (ushort *)(buffer + iVar3);
    *puVar1 = (ushort)iVar4 << 8 | (ushort)iVar4 >> 8;
    iVar4 = 0;
    if ((uint)class < 0x10000) {
      iVar4 = class;
    }
    uVar5 = 0;
    if (0 < ttl) {
      uVar5 = ttl;
    }
    puVar1[1] = (ushort)iVar4 << 8 | (ushort)iVar4 >> 8;
    *(uint *)(puVar1 + 2) =
         uVar5 >> 0x18 | (uVar5 & 0xff0000) >> 8 | (uVar5 & 0xff00) << 8 | uVar5 << 0x18;
    if (type == 0x1c) {
      (buffer + (long)iVar3 + 8)[0] = '\0';
      (buffer + (long)iVar3 + 8)[1] = '\x10';
      uVar2 = *(undefined8 *)((long)rdata + 8);
      *(undefined8 *)(puVar1 + 5) = *rdata;
      *(undefined8 *)(puVar1 + 9) = uVar2;
      iVar4 = 0x1a;
    }
    else if (type == 5) {
      iVar4 = str_to_label((char *)(puVar1 + 5),(char *)rdata,0x208);
      *(ushort *)(buffer + (long)iVar3 + 8) = (ushort)iVar4 << 8 | (ushort)iVar4 >> 8;
      iVar4 = iVar4 + 10;
    }
    else {
      if (type != 1) {
        return -1;
      }
      (buffer + (long)iVar3 + 8)[0] = '\0';
      (buffer + (long)iVar3 + 8)[1] = '\x04';
      *(undefined4 *)(buffer + (long)iVar3 + 10) = *rdata;
      iVar4 = 0xe;
    }
    iVar4 = iVar4 + iVar3;
  }
  return iVar4;
}

Assistant:

int write_dns_answer(char *buffer, const char *name, int type, int class,
                     int ttl, const void *rdata) {
  // TODO: 添加异常处理
  struct answer_struct *answer;
  int count, size, tmp; //临时变量
  size = str_to_label(buffer, name, MAX_DNS_SIZE);
  if (size == -1)
    return -1;
  else {
    buffer += size;
    count = size;
  };
  answer = (struct answer_struct *)buffer;
  answer->type = htons(IN_16b_RANGE(type) ? type : 0);
  answer->class_ = htons(IN_16b_RANGE(class) ? class : 0);
  answer->ttl = htonl(IN_32b_RANGE(ttl) ? ttl : 0);
  tmp = sizeof(struct answer_struct);
  buffer += tmp;
  switch (type) {
  case RRTYPE_A:
    answer->length = htons(4);
    size = 4;
    memcpy(buffer, rdata, size);
    break;
  case RRTYPE_AAAA:
    answer->length = htons(16);
    size = 16;
    memcpy(buffer, rdata, size);
    break;
  case RRTYPE_CNAME:
    size = str_to_label(buffer, (char *)rdata, MAX_DNS_SIZE);
    answer->length = htons(size);
    break;
  // case RRTYPE_MX:
  // break;
  default:
    return -1;
  }

  buffer += size;
  count += tmp + size;
  return count;
}